

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_case.cc
# Opt level: O1

void __thiscall CaseType::GenCleanUpCode(CaseType *this,Output *out_cc,Env *env)

{
  char *pcVar1;
  pointer ppCVar2;
  
  Type::GenCleanUpCode(&this->super_Type,out_cc,env);
  env->in_branch_ = true;
  pcVar1 = Env::RValue(env,this->index_var_);
  Output::println(out_cc,"switch ( %s )",pcVar1);
  out_cc->indent_ = out_cc->indent_ + 1;
  Output::println(out_cc,"{");
  if (this->cases_ != (CaseFieldList *)0x0) {
    for (ppCVar2 = (this->cases_->super__Vector_base<CaseField_*,_std::allocator<CaseField_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        ppCVar2 !=
        (this->cases_->super__Vector_base<CaseField_*,_std::allocator<CaseField_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppCVar2 = ppCVar2 + 1) {
      (*((*ppCVar2)->super_Field).super_DataDepElement._vptr_DataDepElement[9])(*ppCVar2,out_cc,env)
      ;
    }
  }
  Output::println(out_cc,"}");
  out_cc->indent_ = out_cc->indent_ + -1;
  env->in_branch_ = false;
  return;
}

Assistant:

void CaseType::GenCleanUpCode(Output* out_cc, Env* env)
	{
	Type::GenCleanUpCode(out_cc, env);

	env->set_in_branch(true);
	out_cc->println("switch ( %s )", env->RValue(index_var_));
	out_cc->inc_indent();
	out_cc->println("{");
	foreach (i, CaseFieldList, cases_)
		{
		CaseField* c = *i;
		c->GenCleanUpCode(out_cc, env);
		}
	out_cc->println("}");
	out_cc->dec_indent();
	env->set_in_branch(false);
	}